

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType::ArrayFeatureType
          (ArrayFeatureType *this,ArrayFeatureType *from)

{
  uint32_t uVar1;
  ulong uVar2;
  ArrayFeatureType_ShapeRange *this_00;
  ArrayFeatureType_EnumeratedShapes *this_01;
  undefined1 *puVar3;
  Arena *pAVar4;
  int32_t iVar5;
  DefaultOptionalValueUnion DVar6;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_004b0e18;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->shape_,&from->shape_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  this->datatype_ = from->datatype_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x15) {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x15;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>(pAVar4);
    (this->ShapeFlexibility_).enumeratedshapes_ = this_01;
    if (from->_oneof_case_[0] == 0x15) {
      puVar3 = (undefined1 *)(from->ShapeFlexibility_).enumeratedshapes_;
    }
    else {
      puVar3 = _ArrayFeatureType_EnumeratedShapes_default_instance_;
    }
    ArrayFeatureType_EnumeratedShapes::MergeFrom
              (this_01,(ArrayFeatureType_EnumeratedShapes *)puVar3);
  }
  else if (from->_oneof_case_[0] == 0x1f) {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_00 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar4);
    (this->ShapeFlexibility_).shaperange_ = this_00;
    if (from->_oneof_case_[0] == 0x1f) {
      puVar3 = (undefined1 *)(from->ShapeFlexibility_).shaperange_;
    }
    else {
      puVar3 = _ArrayFeatureType_ShapeRange_default_instance_;
    }
    ArrayFeatureType_ShapeRange::MergeFrom(this_00,(ArrayFeatureType_ShapeRange *)puVar3);
  }
  this->_oneof_case_[1] = 0;
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x3d) {
    if (uVar1 == 0x3d) {
      DVar6 = from->defaultOptionalValue_;
    }
    else {
      DVar6.doubledefaultvalue_ = 0.0;
    }
    this->_oneof_case_[1] = 0x3d;
    (this->defaultOptionalValue_).doubledefaultvalue_ = (double)DVar6;
  }
  else if (uVar1 == 0x33) {
    if (uVar1 == 0x33) {
      iVar5 = (from->defaultOptionalValue_).intdefaultvalue_;
    }
    else {
      iVar5 = 0;
    }
    this->_oneof_case_[1] = 0x33;
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar5;
  }
  else if (uVar1 == 0x29) {
    iVar5 = (from->defaultOptionalValue_).intdefaultvalue_;
    this->_oneof_case_[1] = 0x29;
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar5;
  }
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType(const ArrayFeatureType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shape_(from.shape_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  datatype_ = from.datatype_;
  clear_has_ShapeFlexibility();
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      _internal_mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from._internal_enumeratedshapes());
      break;
    }
    case kShapeRange: {
      _internal_mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from._internal_shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  clear_has_defaultOptionalValue();
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      _internal_set_intdefaultvalue(from._internal_intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      _internal_set_floatdefaultvalue(from._internal_floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      _internal_set_doubledefaultvalue(from._internal_doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureType)
}